

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::SubroutineSymbol::serializeTo(SubroutineSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  Type *__n;
  Statement *__n_00;
  reference ppFVar2;
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar3;
  FormalArgumentSymbol *arg;
  iterator __end2;
  iterator __begin2;
  ArgList *__range2;
  Symbol *in_stack_fffffffffffffea8;
  ASTSerializer *in_stack_fffffffffffffeb0;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffeb8;
  undefined1 *__n_01;
  ASTSerializer *this_00;
  ASTSerializer *this_01;
  ASTSerializer *this_02;
  ASTSerializer *this_03;
  bitmask<slang::ast::MethodFlags> flags;
  undefined1 local_f0 [32];
  int local_d0;
  void *local_c8;
  FormalArgumentSymbol *local_c0;
  FormalArgumentSymbol **local_b8;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_b0;
  long local_a8;
  SubroutineSymbol *local_90;
  SubroutineSymbol *this_04;
  int local_80;
  void *local_78;
  int local_70;
  void *local_68;
  size_t local_60;
  int local_50;
  void *local_48;
  size_t local_40;
  int local_30;
  void *local_28;
  int local_20;
  void *local_18;
  
  this_00 = in_RSI;
  this_04 = local_90;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_fffffffffffffeb8);
  __n = getReturnType((SubroutineSymbol *)0x45f26f);
  ASTSerializer::write(this_00,local_20,local_18,(size_t)__n);
  this_01 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_fffffffffffffeb8);
  sVar3 = ast::toString(Automatic);
  local_40 = sVar3._M_len;
  ASTSerializer::write(this_01,local_30,local_28,local_40);
  this_02 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_fffffffffffffeb8);
  sVar3 = ast::toString(Function);
  local_60 = sVar3._M_len;
  ASTSerializer::write(this_02,local_50,local_48,local_60);
  this_03 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_fffffffffffffeb8);
  __n_00 = getBody(this_04);
  ASTSerializer::write(this_03,local_70,local_68,(size_t)__n_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_fffffffffffffeb8);
  _local_90 = ast::toString(Public);
  ASTSerializer::write(in_RSI,local_80,local_78,(size_t)local_90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_fffffffffffffeb8);
  sVar3._M_str = (char *)this_02;
  sVar3._M_len = (size_t)this_01;
  ASTSerializer::startArray(this_00,sVar3);
  local_a8 = in_RDI + 0xf8;
  local_b0._M_current =
       (FormalArgumentSymbol **)
       std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffea8);
  local_b8 = (FormalArgumentSymbol **)
             std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                       (in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffea8);
    flags.m_bits = (underlying_type)((ulong)this_03 >> 0x30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_b0);
    local_c0 = *ppFVar2;
    ASTSerializer::serialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,false);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_b0);
  }
  ASTSerializer::endArray((ASTSerializer *)0x45f4f5);
  bVar1 = slang::bitmask::operator_cast_to_bool((bitmask<slang::ast::MethodFlags> *)0x45f506);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_fffffffffffffeb8);
    __n_01 = local_f0;
    flagsToStr_abi_cxx11_(flags);
    ASTSerializer::write(in_RSI,local_d0,local_c8,(size_t)__n_01);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  }
  return;
}

Assistant:

void SubroutineSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("returnType", getReturnType());
    serializer.write("defaultLifetime", toString(defaultLifetime));
    serializer.write("subroutineKind", toString(subroutineKind));
    serializer.write("body", getBody());
    serializer.write("visibility", toString(visibility));

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    if (flags)
        serializer.write("flags", flagsToStr(flags));
}